

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_Wrap2D_Test::TestBody(Image_Wrap2D_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<float> init;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  WrapMode2D wrapMode_01;
  WrapMode2D wrapMode_02;
  WrapMode2D wrapMode_03;
  WrapMode2D wrapMode_04;
  WrapMode2D wrapMode_05;
  WrapMode2D wrapMode_06;
  Point2i p;
  Point2i p_00;
  Point2i p_01;
  Point2i p_02;
  Point2i p_03;
  Point2i p_04;
  Point2i p_05;
  Point2i p_06;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  bool bVar1;
  char *pcVar2;
  Tuple2<pbrt::Point2,_float> this_00;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Image zeroOne;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> texels;
  type *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffa64;
  WrapMode in_stack_fffffffffffffa68;
  WrapMode in_stack_fffffffffffffa6c;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffa74;
  undefined4 in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffa84;
  undefined8 in_stack_fffffffffffffa88;
  Type type;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffa94;
  char *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  int in_stack_fffffffffffffad4;
  Image *in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 uVar12;
  WrapMode in_stack_fffffffffffffae4;
  WrapMode in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  int in_stack_fffffffffffffaf0;
  int iVar13;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffb30;
  Image *in_stack_fffffffffffffb38;
  Tuple2<pbrt::Point2,_float> wrapMode_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  Tuple2<pbrt::Point2,_float> p_07;
  undefined1 *puVar14;
  Tuple2<pbrt::Point2,_int> resolution;
  AssertionResult local_468 [3];
  Float local_434;
  undefined8 local_430;
  AssertionResult local_428 [3];
  Float local_3f4;
  undefined8 local_3f0;
  AssertionResult local_3e8 [3];
  Float local_3b8;
  undefined4 local_3b4;
  AssertionResult local_3b0 [3];
  Float local_380;
  undefined4 local_37c;
  AssertionResult local_378 [3];
  Float local_348;
  undefined4 local_344;
  AssertionResult local_340 [3];
  Float local_310;
  undefined4 local_30c;
  AssertionResult local_308 [3];
  Float local_2d8;
  undefined4 local_2d4;
  AssertionResult local_2d0 [3];
  Float local_2a0;
  undefined4 local_29c;
  AssertionResult local_298 [3];
  Float local_268;
  undefined4 local_264;
  AssertionResult local_260 [3];
  Float local_230;
  undefined4 local_22c;
  AssertionResult local_228;
  undefined1 local_212;
  allocator<char> local_211;
  undefined1 *local_210;
  undefined1 local_208 [32];
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 *local_38;
  undefined8 local_30;
  
  local_68 = 0x3f80000000000000;
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_38 = &local_68;
  local_30 = 9;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)
             CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  init._M_array._4_4_ = in_stack_fffffffffffffa7c;
  init._M_array._0_4_ = in_stack_fffffffffffffa78;
  init._M_len._0_4_ = in_stack_fffffffffffffa80;
  init._M_len._4_4_ = in_stack_fffffffffffffa84;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),init,
             (polymorphic_allocator<float> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)
             CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (polymorphic_allocator<float> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),(int)in_stack_fffffffffffffa58);
  local_212 = 1;
  puVar14 = local_208;
  resolution = (Tuple2<pbrt::Point2,_int>)&local_211;
  local_210 = puVar14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),in_stack_fffffffffffffa98
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  local_212 = 0;
  local_1e8 = local_208;
  local_1e0 = 1;
  v._M_array._4_4_ = in_stack_fffffffffffffa6c;
  v._M_array._0_4_ = in_stack_fffffffffffffa68;
  v._M_len._0_4_ = in_stack_fffffffffffffa70;
  v._M_len._4_4_ = in_stack_fffffffffffffa74;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),v);
  channels.n = (size_t)puVar14;
  channels.ptr = in_stack_fffffffffffffb40;
  pbrt::Image::Image(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,(Point2i)resolution,
                     channels);
  wrapMode_07 = (Tuple2<pbrt::Point2,_float>)local_208;
  this_00 = (Tuple2<pbrt::Point2,_float>)&local_1e8;
  do {
    this_00 = (Tuple2<pbrt::Point2,_float>)((long)this_00 + -0x20);
    std::__cxx11::string::~string((string *)this_00);
    type = (Type)((ulong)in_stack_fffffffffffffa88 >> 0x20);
  } while (this_00 != wrapMode_07);
  p_07 = this_00;
  std::allocator<char>::~allocator(&local_211);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  local_22c = 1;
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),(int)in_stack_fffffffffffffa58);
  pbrt::WrapMode2D::WrapMode2D
            ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68);
  p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffaf0;
  p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffaec;
  wrapMode.wrap.values[1] = in_stack_fffffffffffffae8;
  wrapMode.wrap.values[0] = in_stack_fffffffffffffae4;
  FVar3 = pbrt::Image::GetChannel(in_stack_fffffffffffffad8,p,in_stack_fffffffffffffad4,wrapMode);
  local_230 = FVar3;
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (int *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (float *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    testing::AssertionResult::failure_message((AssertionResult *)0x5cd83d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),type,
               (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               (Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::Message::~Message((Message *)0x5cd8a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cd8f8);
  local_264 = 1;
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),(int)in_stack_fffffffffffffa58);
  pbrt::WrapMode2D::WrapMode2D
            ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68);
  p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffaf0;
  p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffaec;
  wrapMode_00.wrap.values[1] = in_stack_fffffffffffffae8;
  wrapMode_00.wrap.values[0] = in_stack_fffffffffffffae4;
  local_268 = pbrt::Image::GetChannel
                        (in_stack_fffffffffffffad8,p_00,in_stack_fffffffffffffad4,wrapMode_00);
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (int *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (float *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_260);
  iVar13 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffaf0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x5cda0d);
    in_stack_fffffffffffffae8 = (WrapMode)pcVar2;
    in_stack_fffffffffffffaec = (int)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),type,
               (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               (Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::Message::~Message((Message *)0x5cda70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cdac8);
  local_29c = 0;
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),(int)in_stack_fffffffffffffa58);
  pbrt::WrapMode2D::WrapMode2D
            ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68);
  p_01.super_Tuple2<pbrt::Point2,_int>.y = iVar13;
  p_01.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffaec;
  wrapMode_01.wrap.values[1] = in_stack_fffffffffffffae8;
  wrapMode_01.wrap.values[0] = in_stack_fffffffffffffae4;
  FVar4 = pbrt::Image::GetChannel
                    (in_stack_fffffffffffffad8,p_01,in_stack_fffffffffffffad4,wrapMode_01);
  local_2a0 = FVar4;
  testing::internal::EqHelper<true>::Compare<int,float>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (int *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (float *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             in_stack_fffffffffffffa58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
  uVar12 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffae0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    in_stack_fffffffffffffad8 =
         (Image *)testing::AssertionResult::failure_message((AssertionResult *)0x5cdbdf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),type,
               (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(FVar4,uVar12),(Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::Message::~Message((Message *)0x5cdc42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cdc9a);
  local_2d4 = 0;
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),(int)in_stack_fffffffffffffa58);
  pbrt::WrapMode2D::WrapMode2D
            ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68);
  p_02.super_Tuple2<pbrt::Point2,_int>.y = iVar13;
  p_02.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffaec;
  wrapMode_02.wrap.values[1] = in_stack_fffffffffffffae8;
  wrapMode_02.wrap.values[0] = (WrapMode)FVar4;
  FVar5 = pbrt::Image::GetChannel
                    (in_stack_fffffffffffffad8,p_02,in_stack_fffffffffffffad4,wrapMode_02);
  local_2d8 = FVar5;
  testing::internal::EqHelper<true>::Compare<int,float>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (int *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (float *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             in_stack_fffffffffffffa58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    testing::AssertionResult::failure_message((AssertionResult *)0x5cdda8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),type,
               (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(FVar4,uVar12),(Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::Message::~Message((Message *)0x5cde05);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cde5d);
  local_30c = 0;
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),(int)in_stack_fffffffffffffa58);
  pbrt::WrapMode2D::WrapMode2D
            ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68);
  p_03.super_Tuple2<pbrt::Point2,_int>.y = iVar13;
  p_03.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffaec;
  wrapMode_03.wrap.values[1] = in_stack_fffffffffffffae8;
  wrapMode_03.wrap.values[0] = (WrapMode)FVar4;
  local_310 = pbrt::Image::GetChannel(in_stack_fffffffffffffad8,p_03,(int)FVar5,wrapMode_03);
  testing::internal::EqHelper<true>::Compare<int,float>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (int *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (float *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             in_stack_fffffffffffffa58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_308);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    testing::AssertionResult::failure_message((AssertionResult *)0x5cdf68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),type,
               (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(FVar4,uVar12),(Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::Message::~Message((Message *)0x5cdfc5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ce01d);
  local_344 = 0;
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),(int)in_stack_fffffffffffffa58);
  pbrt::WrapMode2D::WrapMode2D
            ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68);
  p_04.super_Tuple2<pbrt::Point2,_int>.y = iVar13;
  p_04.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffaec;
  wrapMode_04.wrap.values[1] = in_stack_fffffffffffffae8;
  wrapMode_04.wrap.values[0] = (WrapMode)FVar4;
  local_348 = pbrt::Image::GetChannel(in_stack_fffffffffffffad8,p_04,(int)FVar5,wrapMode_04);
  testing::internal::EqHelper<true>::Compare<int,float>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (int *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (float *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             in_stack_fffffffffffffa58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_340);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    testing::AssertionResult::failure_message((AssertionResult *)0x5ce128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),type,
               (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(FVar4,uVar12),(Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::Message::~Message((Message *)0x5ce185);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ce1dd);
  local_37c = 1;
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),(int)in_stack_fffffffffffffa58);
  pbrt::WrapMode2D::WrapMode2D
            ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68);
  p_05.super_Tuple2<pbrt::Point2,_int>.y = iVar13;
  p_05.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffaec;
  wrapMode_05.wrap.values[1] = in_stack_fffffffffffffae8;
  wrapMode_05.wrap.values[0] = (WrapMode)FVar4;
  local_380 = pbrt::Image::GetChannel(in_stack_fffffffffffffad8,p_05,(int)FVar5,wrapMode_05);
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (int *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (float *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_378);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    testing::AssertionResult::failure_message((AssertionResult *)0x5ce2e3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),type,
               (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(FVar4,uVar12),(Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::Message::~Message((Message *)0x5ce340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ce398);
  local_3b4 = 0;
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),(int)in_stack_fffffffffffffa58);
  pbrt::WrapMode2D::WrapMode2D
            ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68);
  p_06.super_Tuple2<pbrt::Point2,_int>.y = iVar13;
  p_06.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffaec;
  wrapMode_06.wrap.values[1] = in_stack_fffffffffffffae8;
  wrapMode_06.wrap.values[0] = (WrapMode)FVar4;
  FVar5 = pbrt::Image::GetChannel(in_stack_fffffffffffffad8,p_06,(int)FVar5,wrapMode_06);
  local_3b8 = FVar5;
  testing::internal::EqHelper<true>::Compare<int,float>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (int *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (float *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             in_stack_fffffffffffffa58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b0);
  uVar11 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa90);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(FVar5,uVar11));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x5ce4a6);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(FVar5,uVar11),type,
               (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(FVar4,uVar12),(Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::Message::~Message((Message *)0x5ce503);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ce55b);
  local_3f0 = 0x3fe0000000000000;
  pbrt::Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (float)((ulong)in_stack_fffffffffffffa58 >> 0x20),SUB84(in_stack_fffffffffffffa58,0));
  pbrt::WrapMode2D::WrapMode2D
            ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c);
  FVar6 = pbrt::Image::BilerpChannel
                    ((Image *)this_00,(Point2f)p_07,(int)FVar3,(WrapMode2D)wrapMode_07);
  local_3f4 = FVar6;
  testing::internal::EqHelper<false>::Compare<double,float>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             (double *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (float *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e8);
  uVar10 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa80);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(FVar5,uVar11));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x5ce666);
    in_stack_fffffffffffffa78 = SUB84(pcVar2,0);
    in_stack_fffffffffffffa7c = (int)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(FVar5,uVar11),type,(char *)CONCAT44(FVar6,uVar10),
               in_stack_fffffffffffffa7c,
               (char *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(FVar4,uVar12),(Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::Message::~Message((Message *)0x5ce6c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ce71b);
  local_430 = 0x3fe0000000000000;
  pbrt::Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (float)((ulong)in_stack_fffffffffffffa58 >> 0x20),SUB84(in_stack_fffffffffffffa58,0));
  pbrt::WrapMode2D::WrapMode2D
            ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
             in_stack_fffffffffffffa6c);
  FVar7 = pbrt::Image::BilerpChannel
                    ((Image *)this_00,(Point2f)p_07,(int)FVar3,(WrapMode2D)wrapMode_07);
  local_434 = FVar7;
  testing::internal::EqHelper<false>::Compare<double,float>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (char *)CONCAT44(FVar7,in_stack_fffffffffffffa70),
             (double *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (float *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
  uVar9 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa70);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(FVar5,uVar11));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x5ce829);
    in_stack_fffffffffffffa68 = (WrapMode)pcVar2;
    in_stack_fffffffffffffa6c = (WrapMode)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(FVar5,uVar11),type,(char *)CONCAT44(FVar6,uVar10),
               in_stack_fffffffffffffa7c,(char *)CONCAT44(FVar7,uVar9));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(FVar4,uVar12),(Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    testing::Message::~Message((Message *)0x5ce886);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ce8de);
  pbrt::Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (float)((ulong)in_stack_fffffffffffffa58 >> 0x20),SUB84(in_stack_fffffffffffffa58,0));
  pbrt::WrapMode2D::WrapMode2D((WrapMode2D *)CONCAT44(FVar7,uVar9),in_stack_fffffffffffffa6c);
  FVar3 = pbrt::Image::BilerpChannel
                    ((Image *)this_00,(Point2f)p_07,(int)FVar3,(WrapMode2D)wrapMode_07);
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (char *)CONCAT44(FVar7,uVar9),
             (int *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
             (float *)CONCAT44(FVar3,in_stack_fffffffffffffa60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_468);
  uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa60);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(FVar5,uVar11));
    testing::AssertionResult::failure_message((AssertionResult *)0x5ce9e5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(FVar5,uVar11),type,(char *)CONCAT44(FVar6,uVar10),
               in_stack_fffffffffffffa7c,(char *)CONCAT44(FVar7,uVar9));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(FVar4,uVar12),(Message *)in_stack_fffffffffffffad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(FVar3,uVar8));
    testing::Message::~Message((Message *)0x5cea40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cea95);
  pbrt::Image::~Image((Image *)CONCAT44(FVar3,uVar8));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)CONCAT44(FVar3,uVar8));
  return;
}

Assistant:

TEST(Image, Wrap2D) {
    pstd::vector<float> texels = {Float(0), Float(1), Float(0), Float(0), Float(0),
                                  Float(0), Float(0), Float(0), Float(0)};
    Image zeroOne(texels, {3, 3}, {"Y"});

    EXPECT_EQ(1, zeroOne.GetChannel({1, -1}, 0, {WrapMode::Clamp, WrapMode::Clamp}));
    EXPECT_EQ(1, zeroOne.GetChannel({1, -1}, 0, {WrapMode::Black, WrapMode::Clamp}));
    EXPECT_EQ(0, zeroOne.GetChannel({1, -1}, 0, {WrapMode::Black, WrapMode::Repeat}));
    EXPECT_EQ(0, zeroOne.GetChannel({1, -1}, 0, {WrapMode::Clamp, WrapMode::Black}));

    EXPECT_EQ(0, zeroOne.GetChannel({1, 3}, 0, {WrapMode::Clamp, WrapMode::Clamp}));
    EXPECT_EQ(0, zeroOne.GetChannel({1, 3}, 0, {WrapMode::Repeat, WrapMode::Clamp}));
    EXPECT_EQ(1, zeroOne.GetChannel({1, 3}, 0, {WrapMode::Black, WrapMode::Repeat}));
    EXPECT_EQ(0, zeroOne.GetChannel({1, 3}, 0, {WrapMode::Clamp, WrapMode::Black}));

    EXPECT_EQ(0.5, zeroOne.BilerpChannel(Point2f(0.5, 0.), 0, WrapMode::Repeat));
    EXPECT_EQ(0.5, zeroOne.BilerpChannel(Point2f(0.5, 0.), 0, WrapMode::Black));
    EXPECT_EQ(1, zeroOne.BilerpChannel(Point2f(0.5, 0.), 0, WrapMode::Clamp));
}